

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::WeightConstraint::integrateRoot(WeightConstraint *this,Solver *s)

{
  bool bVar1;
  ValueRep VVar2;
  uint32 uVar3;
  uint32 uVar4;
  size_type sVar5;
  uint *puVar6;
  LitVec *this_00;
  const_reference pLVar7;
  int iVar8;
  Solver *in_RSI;
  uint32 i_2;
  Literal p;
  uint32 i_1;
  GenericWatch *w;
  uint32 end;
  LitVec *trail;
  Var v;
  uint32 end_1;
  uint32 i;
  uint32 np;
  uint32 vDL;
  uint32 low;
  Solver *in_stack_ffffffffffffff58;
  Solver *in_stack_ffffffffffffff60;
  Solver *this_01;
  undefined4 in_stack_ffffffffffffff68;
  size_type sVar9;
  undefined4 in_stack_ffffffffffffff6c;
  Solver *in_stack_ffffffffffffff70;
  Solver *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  size_type local_64;
  Literal LVar10;
  GenericWatch *pGVar11;
  Literal p_00;
  uint32 local_28;
  int local_24;
  uint32 local_20;
  uint32 local_1c;
  Solver *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  uVar3 = Solver::decisionLevel((Solver *)0x2165d1);
  if (uVar3 != 0) {
    uVar3 = highestUndoLevel((WeightConstraint *)
                             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff78);
    uVar4 = Solver::rootLevel(local_18);
    if ((uVar3 < uVar4) && (bVar1 = Solver::hasConflict((Solver *)0x216610), !bVar1)) {
      local_1c = Solver::decisionLevel((Solver *)0x216640);
      local_24 = 0;
      local_28 = 0;
      uVar3 = size((WeightConstraint *)0x216667);
      for (; local_28 != uVar3; local_28 = local_28 + 1) {
        WL::var((WL *)in_stack_ffffffffffffff60,(uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        VVar2 = Solver::value(in_stack_ffffffffffffff60,
                              (Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        if ((VVar2 != '\0') &&
           (local_20 = Solver::level(in_stack_ffffffffffffff60,
                                     (Var)((ulong)in_stack_ffffffffffffff58 >> 0x20)), local_20 != 0
           )) {
          local_24 = local_24 + 1;
          Solver::markSeen(in_stack_ffffffffffffff60,(Var)((ulong)in_stack_ffffffffffffff58 >> 0x20)
                          );
          puVar6 = std::min<unsigned_int>(&local_1c,&local_20);
          local_1c = *puVar6;
        }
      }
      this_00 = Solver::trail(local_18);
      uVar3 = sizeVec<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                        ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x21673f);
      uVar4 = Solver::queueSize((Solver *)0x216750);
      local_64 = uVar3 - uVar4;
      pGVar11 = (GenericWatch *)0x0;
      for (uVar3 = Solver::levelStart(in_stack_ffffffffffffff60,
                                      (uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          uVar3 != local_64 && local_24 != 0; uVar3 = uVar3 + 1) {
        pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                           (this_00,uVar3);
        uVar4 = pLVar7->rep_;
        LVar10.rep_ = uVar4;
        bVar1 = Solver::seen((Solver *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             ,(Literal)(uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        if ((bVar1) && (iVar8 = local_24 + -1, bVar1 = local_24 != 0, local_24 = iVar8, bVar1)) {
          Literal::var((Literal *)&stack0xffffffffffffffb0);
          Solver::clearSeen(in_stack_ffffffffffffff60,
                            (Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          bVar1 = Solver::hasConflict((Solver *)0x21682b);
          p_00.rep_ = (uint32)((ulong)pGVar11 >> 0x20);
          if (!bVar1) {
            in_stack_ffffffffffffff70 = local_18;
            pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                               (this_00,uVar3);
            pGVar11 = Solver::getWatch((Solver *)CONCAT44(uVar3,LVar10.rep_),p_00,
                                       (Constraint *)CONCAT44(uVar4,pLVar7->rep_));
            if (pGVar11 != (GenericWatch *)0x0) {
              GenericWatch::propagate
                        ((GenericWatch *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         in_stack_ffffffffffffff60,(Literal)(uint32)in_stack_ffffffffffffff70);
            }
          }
        }
      }
      while (sVar9 = local_64,
            sVar5 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                              (this_00), sVar9 != sVar5 && local_24 != 0) {
        this_01 = local_18;
        pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                           (this_00,local_64);
        Literal::var(pLVar7);
        bVar1 = Solver::seen(this_01,(Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        if (bVar1) {
          local_24 = local_24 + -1;
          in_stack_ffffffffffffff58 = local_18;
          pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                             (this_00,local_64);
          Literal::var(pLVar7);
          Solver::clearSeen(this_01,(Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        }
        local_64 = local_64 + 1;
      }
      bVar1 = Solver::hasConflict((Solver *)0x21697d);
      goto LAB_00216988;
    }
  }
  bVar1 = Solver::hasConflict((Solver *)0x216623);
LAB_00216988:
  local_1 = (bool)((bVar1 ^ 0xffU) & 1);
  return local_1;
}

Assistant:

bool WeightConstraint::integrateRoot(Solver& s) {
	if (!s.decisionLevel() || highestUndoLevel(s) >= s.rootLevel() || s.hasConflict()) { return !s.hasConflict(); }
	// check if constraint has assigned literals
	uint32 low = s.decisionLevel(), vDL;
	uint32 np  = 0;
	for (uint32 i = 0, end = size(); i != end; ++i) {
		Var v = lits_->var(i);
		if (s.value(v) != value_free && (vDL = s.level(v)) != 0) {
			++np;
			s.markSeen(v);
			low = std::min(low, vDL);
		}
	}
	// propagate assigned literals in assignment order
	const LitVec& trail = s.trail();
	const uint32  end   = sizeVec(trail) - s.queueSize();
	GenericWatch* w     = 0;
	for (uint32 i = s.levelStart(low); i != end && np; ++i) {
		Literal p = trail[i];
		if (s.seen(p) && np--) {
			s.clearSeen(p.var());
			if (!s.hasConflict() && (w = s.getWatch(trail[i], this)) != 0) {
				w->propagate(s, p);
			}
		}
	}
	for (uint32 i = end; i != trail.size() && np; ++i) {
		if (s.seen(trail[i].var())) { --np; s.clearSeen(trail[i].var()); }
	}
	return !s.hasConflict();
}